

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

Boxed_Value chaiscript::parser::ChaiScript_Parser::buildInt(int base,string *t_val,bool prefixed)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  unsigned_long uVar6;
  longlong lVar7;
  byte in_CL;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  element_type *in_RDI;
  Boxed_Value BVar8;
  out_of_range *anon_var_0_1;
  unsigned_long_long u_1;
  out_of_range *anon_var_0;
  longlong u;
  string val;
  char val_1;
  size_type i;
  bool longlong_;
  bool long_;
  bool unsigned_;
  unsigned_long_long *in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe98;
  ulong uVar9;
  allocator<char> *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffeb8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffec0;
  allocator<char> local_69;
  undefined8 local_68;
  undefined8 local_60;
  char *local_58;
  string local_50 [39];
  char local_29;
  long local_28;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  string *local_18;
  int local_c;
  
  local_19 = in_CL & 1;
  local_1a = 0;
  local_1b = 0;
  local_1c = 0;
  local_18 = in_RDX;
  local_c = in_ESI;
  for (local_28 = std::__cxx11::string::size(); local_28 != 0; local_28 = local_28 + -1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
    local_29 = *pcVar3;
    if ((local_29 == 'u') || (local_29 == 'U')) {
      local_1a = 1;
    }
    else {
      if ((local_29 != 'l') && (local_29 != 'L')) break;
      if ((local_1b & 1) != 0) {
        local_1c = 1;
      }
      local_1b = 1;
    }
  }
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::string(local_50,local_18);
  }
  else {
    local_60 = std::__cxx11::string::begin();
    local_58 = (char *)__gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator+(in_stack_fffffffffffffe98,
                                   (difference_type)in_stack_fffffffffffffe90);
    local_68 = std::__cxx11::string::end();
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffea8);
    std::allocator<char>::~allocator(&local_69);
  }
  uVar4 = std::__cxx11::stoll(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,0);
  if (((((local_1a & 1) == 0) && ((local_1b & 1) == 0)) &&
      (iVar1 = std::numeric_limits<int>::min(), (long)iVar1 <= (long)uVar4)) &&
     (iVar1 = std::numeric_limits<int>::max(), (long)uVar4 <= (long)iVar1)) {
    const_var<int>((int *)in_stack_fffffffffffffe88);
  }
  else if ((((local_1a & 1) == 0) && (local_c == 10)) ||
          (((local_1b & 1) != 0 ||
           ((uVar2 = std::numeric_limits<unsigned_int>::min(), (long)uVar4 < (long)(ulong)uVar2 ||
            (uVar9 = uVar4, uVar2 = std::numeric_limits<unsigned_int>::max(),
            (long)(ulong)uVar2 < (long)uVar9)))))) {
    if (((local_1a & 1) == 0) &&
       ((((local_1c & 1) == 0 &&
         (uVar9 = uVar4, lVar5 = std::numeric_limits<long>::min(), lVar5 <= (long)uVar9)) &&
        (uVar9 = uVar4, lVar5 = std::numeric_limits<long>::max(), (long)uVar9 <= lVar5)))) {
      const_var<long>((long *)in_stack_fffffffffffffe88);
    }
    else if ((((local_1a & 1) == 0) && (local_c == 10)) ||
            (((local_1c & 1) != 0 ||
             ((uVar9 = uVar4, uVar6 = std::numeric_limits<unsigned_long>::min(), uVar9 < uVar6 ||
              (uVar6 = std::numeric_limits<unsigned_long>::max(), uVar6 < uVar4)))))) {
      if (((local_1a & 1) == 0) &&
         ((uVar9 = uVar4, lVar7 = std::numeric_limits<long_long>::min(), lVar7 <= (long)uVar9 &&
          (lVar7 = std::numeric_limits<long_long>::max(), (long)uVar4 <= lVar7)))) {
        const_var<long_long>((longlong *)in_stack_fffffffffffffe88);
      }
      else {
        const_var<unsigned_long_long>(in_stack_fffffffffffffe88);
      }
    }
    else {
      const_var<unsigned_long>(in_stack_fffffffffffffe88);
    }
  }
  else {
    const_var<unsigned_int>((uint *)in_stack_fffffffffffffe88);
  }
  std::__cxx11::string::~string(local_50);
  BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value buildInt(const int base, const std::string &t_val, const bool prefixed)
      {
        bool unsigned_ = false;
        bool long_ = false;
        bool longlong_ = false;

        auto i = t_val.size();

        for (; i > 0; --i)
        {
          const char val = t_val[i-1];

          if (val == 'u' || val == 'U')
          {
            unsigned_ = true;
          } else if (val == 'l' || val == 'L') {
            if (long_)
            {
              longlong_ = true;
            }

            long_ = true;
          } else {
            break;
          }
        }

        const auto val = prefixed?std::string(t_val.begin()+2,t_val.end()):t_val;

#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wsign-compare"

#ifdef CHAISCRIPT_CLANG
#pragma GCC diagnostic ignored "-Wtautological-compare"
#endif

#endif

        try {
          auto u = std::stoll(val,nullptr,base);


          if (!unsigned_ && !long_ && u >= std::numeric_limits<int>::min() && u <= std::numeric_limits<int>::max()) {
            return const_var(static_cast<int>(u));
          } else if ((unsigned_ || base != 10) && !long_ && u >= std::numeric_limits<unsigned int>::min() && u <= std::numeric_limits<unsigned int>::max()) {
            return const_var(static_cast<unsigned int>(u));
          } else if (!unsigned_ && !longlong_ && u >= std::numeric_limits<long>::min() && u <= std::numeric_limits<long>::max()) {
            return const_var(static_cast<long>(u));
          } else if ((unsigned_ || base != 10) && !longlong_ && u >= std::numeric_limits<unsigned long>::min() && u <= std::numeric_limits<unsigned long>::max()) {
            return const_var(static_cast<unsigned long>(u));
          } else if (!unsigned_ && u >= std::numeric_limits<long long>::min() && u <= std::numeric_limits<long long>::max()) {
            return const_var(static_cast<long long>(u));
          } else {
            return const_var(static_cast<unsigned long long>(u));
          }

        } catch (const std::out_of_range &) {
          // too big to be signed
          try {
            auto u = std::stoull(val,nullptr,base);

            if (u >= std::numeric_limits<unsigned long>::min() && u <= std::numeric_limits<unsigned long>::max()) {
              return const_var(static_cast<unsigned long>(u));
            } else {
              return const_var(static_cast<unsigned long long>(u));
            }
          } catch (const std::out_of_range &) {
            // it's just simply too big
            return const_var(std::numeric_limits<long long>::max());
          }
        }

#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif

      }